

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::Optimizer::clear_OptimizerType(Optimizer *this)

{
  if (((this->_oneof_case_[0] == 0xb) || (this->_oneof_case_[0] == 10)) &&
     ((this->OptimizerType_).sgdoptimizer_ != (SGDOptimizer *)0x0)) {
    (*(((this->OptimizerType_).sgdoptimizer_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void Optimizer::clear_OptimizerType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.Optimizer)
  switch (OptimizerType_case()) {
    case kSgdOptimizer: {
      delete OptimizerType_.sgdoptimizer_;
      break;
    }
    case kAdamOptimizer: {
      delete OptimizerType_.adamoptimizer_;
      break;
    }
    case OPTIMIZERTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = OPTIMIZERTYPE_NOT_SET;
}